

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_estimateCCtxSize_usingCCtxParams(ZSTD_CCtx_params *params)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong maxChunkSize;
  ZSTD_compressionParameters cParams;
  ZSTD_compressionParameters local_4c;
  
  if (0 < params->nbWorkers) {
    return 0xffffffffffffffff;
  }
  ZSTD_getCParamsFromCCtxParams(&local_4c,params,0,0);
  maxChunkSize = 1L << ((byte)local_4c.windowLog & 0x3f);
  if (0x1ffff < maxChunkSize) {
    maxChunkSize = 0x20000;
  }
  uVar5 = 0x11;
  if (local_4c.windowLog < 0x11) {
    uVar5 = local_4c.windowLog;
  }
  uVar6 = (ulong)uVar5;
  if (local_4c.minMatch != 3) {
    uVar6 = 0;
  }
  uVar4 = 1L << ((byte)local_4c.chainLog & 0x3f);
  if (local_4c.strategy == ZSTD_fast) {
    uVar4 = 0;
  }
  sVar2 = ZSTD_ldm_getTableSize(params->ldmParams);
  sVar3 = ZSTD_ldm_getMaxNbSeq(params->ldmParams,maxChunkSize);
  uVar1 = maxChunkSize + 0x24608;
  if (local_4c.strategy < ZSTD_btopt) {
    uVar1 = maxChunkSize;
  }
  return uVar1 + (uint)((int)((maxChunkSize & 0xffffffff) / (ulong)((local_4c.minMatch != 3) + 3)) *
                       0xb) + sVar2 + sVar3 * 0xc +
         ((1L << ((byte)uVar6 & 0x3f)) + (1L << ((byte)local_4c.hashLog & 0x3f)) + uVar4) * 4 +
         0x3fc0;
}

Assistant:

size_t ZSTD_estimateCCtxSize_usingCCtxParams(const ZSTD_CCtx_params* params)
{
    /* Estimate CCtx size is supported for single-threaded compression only. */
    if (params->nbWorkers > 0) { return ERROR(GENERIC); }
    {   ZSTD_compressionParameters const cParams =
                ZSTD_getCParamsFromCCtxParams(params, 0, 0);
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, (size_t)1 << cParams.windowLog);
        U32    const divider = (cParams.minMatch==3) ? 3 : 4;
        size_t const maxNbSeq = blockSize / divider;
        size_t const tokenSpace = WILDCOPY_OVERLENGTH + blockSize + 11*maxNbSeq;
        size_t const entropySpace = HUF_WORKSPACE_SIZE;
        size_t const blockStateSpace = 2 * sizeof(ZSTD_compressedBlockState_t);
        size_t const matchStateSize = ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 1);

        size_t const ldmSpace = ZSTD_ldm_getTableSize(params->ldmParams);
        size_t const ldmSeqSpace = ZSTD_ldm_getMaxNbSeq(params->ldmParams, blockSize) * sizeof(rawSeq);

        size_t const neededSpace = entropySpace + blockStateSpace + tokenSpace +
                                   matchStateSize + ldmSpace + ldmSeqSpace;

        DEBUGLOG(5, "sizeof(ZSTD_CCtx) : %u", (U32)sizeof(ZSTD_CCtx));
        DEBUGLOG(5, "estimate workSpace : %u", (U32)neededSpace);
        return sizeof(ZSTD_CCtx) + neededSpace;
    }
}